

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# life.cxx
# Opt level: O3

int iterateLife(Bitmap *pixels)

{
  OledPoint p;
  bool bVar1;
  int iVar2;
  int col;
  long lVar3;
  int row;
  long lVar4;
  Bitmap last;
  int local_444;
  long local_440;
  OledBitmap<128,_64> local_438;
  
  local_438.super_OledPixel._vptr_OledPixel = (_func_int **)&PTR__OledPixel_00109bb8;
  memcpy(&local_438.blocks_,&pixels->blocks_,0x400);
  local_440 = 0;
  lVar4 = 0;
  local_444 = 0;
  while( true ) {
    iVar2 = (*(pixels->super_OledPixel)._vptr_OledPixel[9])(pixels);
    if (iVar2 <= lVar4) break;
    lVar3 = 0;
    while( true ) {
      iVar2 = (*(pixels->super_OledPixel)._vptr_OledPixel[8])(pixels);
      if (iVar2 <= lVar3) break;
      p = (OledPoint)(local_440 + lVar3);
      bVar1 = SSD1306::OledBitmap<128,_64>::isSetPixel(&local_438,p);
      iVar2 = neighbours(&local_438.super_OledPixel,(int)lVar3,(int)lVar4);
      if ((iVar2 < 2) || ((iVar2 != 3 && (!bVar1 || iVar2 != 2)))) {
        (*(pixels->super_OledPixel)._vptr_OledPixel[6])(pixels,p);
      }
      else {
        (*(pixels->super_OledPixel)._vptr_OledPixel[5])(pixels,p);
        local_444 = local_444 + 1;
      }
      lVar3 = lVar3 + 1;
    }
    lVar4 = lVar4 + 1;
    local_440 = local_440 + 0x100000000;
  }
  SSD1306::OledPixel::~OledPixel(&local_438.super_OledPixel);
  return local_444;
}

Assistant:

int
iterateLife(
    Bitmap& pixels)
{
    int population = 0;
    Bitmap last = pixels;

    for (auto row = 0 ; row < pixels.height() ; ++row)
    {
        for (auto col = 0 ; col < pixels.width() ; ++col)
        {
            Point p{col, row};
            bool live = last.isSetPixel(p);
            int n = neighbours(last, col, row);

            if (n < 2)
            {
                live = false;
            }
            else if (live && (n == 2))
            {
                live = true;
            }
            else if (n == 3)
            {
                live = true;
            }
            else
            {
                live = false;
            }

            if (live)
            {
                ++population;

                pixels.setPixel(p);
            }
            else
            {
                pixels.unsetPixel(p);
            }
        }
    }

    return population;
}